

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictbe.cpp
# Opt level: O0

void __thiscall
icu_63::KhmerBreakEngine::KhmerBreakEngine
          (KhmerBreakEngine *this,DictionaryMatcher *adoptDictionary,UErrorCode *status)

{
  UBool UVar1;
  ConstChar16Ptr local_c0;
  UnicodeString local_b8;
  ConstChar16Ptr local_78;
  UnicodeString local_70;
  UErrorCode *local_20;
  UErrorCode *status_local;
  DictionaryMatcher *adoptDictionary_local;
  KhmerBreakEngine *this_local;
  
  local_20 = status;
  status_local = (UErrorCode *)adoptDictionary;
  adoptDictionary_local = (DictionaryMatcher *)this;
  DictionaryBreakEngine::DictionaryBreakEngine(&this->super_DictionaryBreakEngine);
  (this->super_DictionaryBreakEngine).super_LanguageBreakEngine._vptr_LanguageBreakEngine =
       (_func_int **)&PTR__KhmerBreakEngine_002bdbc0;
  UnicodeSet::UnicodeSet(&this->fKhmerWordSet);
  UnicodeSet::UnicodeSet(&this->fEndWordSet);
  UnicodeSet::UnicodeSet(&this->fBeginWordSet);
  UnicodeSet::UnicodeSet(&this->fMarkSet);
  this->fDictionary = (DictionaryMatcher *)status_local;
  ConstChar16Ptr::ConstChar16Ptr(&local_78,L"[[:Khmr:]&[:LineBreak=SA:]]");
  UnicodeString::UnicodeString(&local_70,'\x01',&local_78,-1);
  UnicodeSet::applyPattern(&this->fKhmerWordSet,&local_70,local_20);
  UnicodeString::~UnicodeString(&local_70);
  ConstChar16Ptr::~ConstChar16Ptr(&local_78);
  UVar1 = ::U_SUCCESS(*local_20);
  if (UVar1 != '\0') {
    (*(this->super_DictionaryBreakEngine).super_LanguageBreakEngine._vptr_LanguageBreakEngine[4])
              (this,&this->fKhmerWordSet);
  }
  ConstChar16Ptr::ConstChar16Ptr(&local_c0,L"[[:Khmr:]&[:LineBreak=SA:]&[:M:]]");
  UnicodeString::UnicodeString(&local_b8,'\x01',&local_c0,-1);
  UnicodeSet::applyPattern(&this->fMarkSet,&local_b8,local_20);
  UnicodeString::~UnicodeString(&local_b8);
  ConstChar16Ptr::~ConstChar16Ptr(&local_c0);
  UnicodeSet::add(&this->fMarkSet,0x20);
  UnicodeSet::operator=(&this->fEndWordSet,&this->fKhmerWordSet);
  UnicodeSet::add(&this->fBeginWordSet,0x1780,0x17b3);
  UnicodeSet::remove(&this->fEndWordSet,(char *)0x17d2);
  UnicodeSet::compact(&this->fMarkSet);
  UnicodeSet::compact(&this->fEndWordSet);
  UnicodeSet::compact(&this->fBeginWordSet);
  return;
}

Assistant:

KhmerBreakEngine::KhmerBreakEngine(DictionaryMatcher *adoptDictionary, UErrorCode &status)
    : DictionaryBreakEngine(),
      fDictionary(adoptDictionary)
{
    fKhmerWordSet.applyPattern(UNICODE_STRING_SIMPLE("[[:Khmr:]&[:LineBreak=SA:]]"), status);
    if (U_SUCCESS(status)) {
        setCharacters(fKhmerWordSet);
    }
    fMarkSet.applyPattern(UNICODE_STRING_SIMPLE("[[:Khmr:]&[:LineBreak=SA:]&[:M:]]"), status);
    fMarkSet.add(0x0020);
    fEndWordSet = fKhmerWordSet;
    fBeginWordSet.add(0x1780, 0x17B3);
    //fBeginWordSet.add(0x17A3, 0x17A4);      // deprecated vowels
    //fEndWordSet.remove(0x17A5, 0x17A9);     // Khmer independent vowels that can't end a word
    //fEndWordSet.remove(0x17B2);             // Khmer independent vowel that can't end a word
    fEndWordSet.remove(0x17D2);             // KHMER SIGN COENG that combines some following characters
    //fEndWordSet.remove(0x17B6, 0x17C5);     // Remove dependent vowels
//    fEndWordSet.remove(0x0E31);             // MAI HAN-AKAT
//    fEndWordSet.remove(0x0E40, 0x0E44);     // SARA E through SARA AI MAIMALAI
//    fBeginWordSet.add(0x0E01, 0x0E2E);      // KO KAI through HO NOKHUK
//    fBeginWordSet.add(0x0E40, 0x0E44);      // SARA E through SARA AI MAIMALAI
//    fSuffixSet.add(THAI_PAIYANNOI);
//    fSuffixSet.add(THAI_MAIYAMOK);

    // Compact for caching.
    fMarkSet.compact();
    fEndWordSet.compact();
    fBeginWordSet.compact();
//    fSuffixSet.compact();
}